

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O1

void WriteVectorToFile<float>(FILE *file_ptr,vector<float,_std::allocator<float>_> *vec)

{
  pointer pfVar1;
  pointer pfVar2;
  ostream *poVar3;
  size_t len;
  Logger local_64;
  string local_60;
  string local_40;
  
  if (file_ptr == (FILE *)0x0) {
    local_64.severity_ = ERR;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,"");
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"WriteVectorToFile","");
    poVar3 = Logger::Start(ERR,&local_60,0x10f,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"file_ptr",8);
    std::operator<<(poVar3," == NULL \n");
  }
  else {
    pfVar1 = (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pfVar1 != pfVar2) {
      local_60._M_dataplus._M_p = (pointer)((long)pfVar2 - (long)pfVar1 >> 2);
      WriteDataToDisk(file_ptr,(char *)&local_60,8);
      WriteDataToDisk(file_ptr,(char *)(vec->super__Vector_base<float,_std::allocator<float>_>).
                                       _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60._M_dataplus._M_p << 2);
      return;
    }
    local_64.severity_ = ERR;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,"");
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"WriteVectorToFile","");
    poVar3 = Logger::Start(ERR,&local_60,0x111,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x111);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!vec.empty()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::operator<<(poVar3,"\n");
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  Logger::~Logger(&local_64);
  abort();
}

Assistant:

void WriteVectorToFile(FILE *file_ptr, const std::vector<T> &vec) {
  CHECK_NOTNULL(file_ptr);
  // We do not want to serialize an empty vector
  CHECK(!vec.empty());
  size_t len = vec.size();
  // First, write the length of this vector
  WriteDataToDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  // Then, write the data of this vector
  WriteDataToDisk(file_ptr, (char *)(vec.data()), sizeof(T)*len);
}